

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pai.c
# Opt level: O3

void duckdb_je_pai_dalloc_batch_default
               (tsdn_t *tsdn,pai_t *self,edata_list_active_t *list,_Bool *deferred_work_generated)

{
  edata_t *peVar1;
  edata_t *peVar2;
  _Bool deferred_by_dalloc;
  _Bool local_29;
  
  peVar2 = (list->head).qlh_first;
  if (peVar2 != (edata_t *)0x0) {
    do {
      local_29 = false;
      peVar1 = (peVar2->field_5).ql_link_active.qre_next;
      (list->head).qlh_first = peVar1;
      if (peVar1 == peVar2) {
        (list->head).qlh_first = (edata_t *)0x0;
      }
      else {
        (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
             (peVar1->field_5).ql_link_active.qre_prev;
        peVar1 = (peVar2->field_5).ql_link_active.qre_prev;
        (((peVar2->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev = peVar1;
        (peVar2->field_5).ql_link_active.qre_prev = (peVar1->field_5).ql_link_active.qre_next;
        peVar1 = (peVar2->field_5).ql_link_active.qre_next;
        (((peVar1->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar1;
        (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar2;
      }
      (*self->dalloc)(tsdn,self,peVar2,&local_29);
      *deferred_work_generated = (_Bool)(*deferred_work_generated | local_29);
      peVar2 = (list->head).qlh_first;
    } while (peVar2 != (edata_t *)0x0);
  }
  return;
}

Assistant:

void
pai_dalloc_batch_default(tsdn_t *tsdn, pai_t *self,
    edata_list_active_t *list, bool *deferred_work_generated) {
	edata_t *edata;
	while ((edata = edata_list_active_first(list)) != NULL) {
		bool deferred_by_dalloc = false;
		edata_list_active_remove(list, edata);
		pai_dalloc(tsdn, self, edata, &deferred_by_dalloc);
		*deferred_work_generated |= deferred_by_dalloc;
	}
}